

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O2

dlist_t * dlist_ins_before(dlist_head_t *head,dlist_t *dlist,void *data)

{
  uint __line;
  int iVar1;
  dlist_t *new;
  char *__assertion;
  
  if (head == (dlist_head_t *)0x0) {
    __assertion = "head != NULL";
    __line = 0x5e;
  }
  else {
    if (dlist != (dlist_t *)0x0) {
      new = dlist_new(data);
      if (new != (dlist_t *)0x0) {
        iVar1 = dlist_insl_before(head,dlist,new);
        if (iVar1 != 0) {
          return new;
        }
        dlist_delete(new,(_func_void_void_ptr *)0x0);
      }
      return (dlist_t *)0x0;
    }
    __assertion = "dlist != NULL";
    __line = 0x5f;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",
                __line,"dlist_t *dlist_ins_before(dlist_head_t *, dlist_t *, void *)");
}

Assistant:

dlist_t *dlist_ins_before(dlist_head_t *head, dlist_t *dlist, void *data) {
  assert(head != NULL);
  assert(dlist != NULL);
  
  dlist_t *tmp = dlist_new(data);
  
  if (!tmp)
    return NULL;
  
  if (dlist_insl_before(head, dlist, tmp)) {
    return tmp;
  } else {
    dlist_delete(tmp, NULL);
    return NULL;
  }
}